

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O2

ostream * __thiscall smf::Options::print(Options *this,ostream *out)

{
  pointer ppOVar1;
  uint uVar2;
  ostream *poVar3;
  ulong uVar4;
  
  uVar2 = 0;
  while( true ) {
    uVar4 = (ulong)uVar2;
    ppOVar1 = (this->m_optionRegister).
              super__Vector_base<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->m_optionRegister).
                      super__Vector_base<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppOVar1 >> 3) <= uVar4)
    break;
    poVar3 = std::operator<<(out,(string *)ppOVar1[uVar4]);
    poVar3 = std::operator<<(poVar3,"\t");
    poVar3 = std::operator<<(poVar3,(string *)
                                    &(this->m_optionRegister).
                                     super__Vector_base<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar4]->description);
    std::endl<char,std::char_traits<char>>(poVar3);
    uVar2 = uVar2 + 1;
  }
  return out;
}

Assistant:

std::ostream& Options::print(std::ostream& out) {
   for (unsigned int i=0; i<m_optionRegister.size(); i++) {
      out << m_optionRegister[i]->getDefinition() << "\t"
           << m_optionRegister[i]->getDescription() << std::endl;
   }
   return out;
}